

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::updatePivots(HModel *this,int columnIn,int rowOut,int sourceOut)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int columnOut;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)in_EDX);
  iVar3 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)in_EDX);
  *pvVar4 = in_ESI;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)in_ESI);
  *pvVar4 = 0;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)in_ESI);
  *pvVar4 = 0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)in_ESI);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x840),(long)in_EDX);
  *pvVar5 = vVar1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)in_ESI);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x858),(long)in_EDX);
  *pvVar5 = vVar1;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)iVar3);
  *pvVar4 = 1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)iVar3);
  dVar2 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)iVar3);
  if ((dVar2 != *pvVar5) || (NAN(dVar2) || NAN(*pvVar5))) {
    if (in_ECX == -1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)iVar3);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)iVar3);
      *pvVar5 = vVar1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
      *pvVar4 = 1;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)iVar3);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)iVar3);
      *pvVar5 = vVar1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
      *pvVar4 = -1;
    }
  }
  else {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)iVar3);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)iVar3);
    *pvVar5 = vVar1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
    *pvVar4 = 0;
  }
  *(int *)(in_RDI + 0x584) = *(int *)(in_RDI + 0x584) + 1;
  if (iVar3 < *(int *)(in_RDI + 0x60c)) {
    *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + -1;
  }
  if (in_ESI < *(int *)(in_RDI + 0x60c)) {
    *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + 1;
  }
  *(undefined4 *)(in_RDI + 0x5f4) = 0;
  *(undefined4 *)(in_RDI + 0x5f8) = 0;
  *(undefined4 *)(in_RDI + 0x604) = 0;
  return;
}

Assistant:

void HModel::updatePivots(int columnIn, int rowOut, int sourceOut) {
  //  printf("Called updatePivots(%d, %d, %d)\n", columnIn, rowOut, sourceOut);cout<<flush;
  int columnOut = basicIndex[rowOut];

  // Incoming variable
  basicIndex[rowOut] = columnIn;
  nonbasicFlag[columnIn] = 0;
  nonbasicMove[columnIn] = 0;
  baseLower[rowOut] = workLower[columnIn];
  baseUpper[rowOut] = workUpper[columnIn];

  // Outgoing variable
  nonbasicFlag[columnOut] = 1;
  if (workLower[columnOut] == workUpper[columnOut]) {
    workValue[columnOut] = workLower[columnOut];
    nonbasicMove[columnOut] = 0;
  } else if (sourceOut == -1) {
    workValue[columnOut] = workLower[columnOut];
    nonbasicMove[columnOut] = 1;
  } else {
    workValue[columnOut] = workUpper[columnOut];
    nonbasicMove[columnOut] = -1;
  }
  
  //  printf("In updatePivots before countUpdate++\n");cout<<flush;
  countUpdate++;
  //  printf("In updatePivots after countUpdate++\n");cout<<flush;
  //Update the number of basic logicals
  if (columnOut < numCol) numBasicLogicals -= 1;
  if (columnIn < numCol) numBasicLogicals += 1;
  //No longer have a representation of B^{-1}, and certainly not fresh!
  mlFg_haveInvert = 0;
  mlFg_haveFreshInvert = 0;
  //Data are no longer fresh from rebuild
  mlFg_haveFreshRebuild = 0;
}